

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalDefinition.cpp
# Opt level: O0

string * __thiscall
license::locate::ExternalDefinition::retrieve_license_content
          (string *__return_storage_ptr__,ExternalDefinition *this,string *licenseLocation)

{
  __type _Var1;
  size_t sVar2;
  uchar *puVar3;
  char *szptr;
  allocator local_92;
  undefined1 local_91;
  undefined1 local_90 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> raw;
  allocator local_61;
  undefined1 local_60 [8];
  string licData;
  string *licenseLocation_local;
  ExternalDefinition *this_local;
  string *str;
  
  (**(this->super_LocatorStrategy)._vptr_LocatorStrategy)
            ((undefined1 *)((long)&licData.field_2 + 8));
  _Var1 = std::operator==(licenseLocation,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&licData.field_2 + 8));
  std::__cxx11::string::~string((string *)(licData.field_2._M_local_buf + 8));
  if (_Var1) {
    szptr = this->m_location->licenseData;
    sVar2 = mstrnlen_s(szptr,0x1000);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_60,szptr,sVar2,&local_61);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    if (this->m_location->license_data_type == LICENSE_ENCODED) {
      unbase64((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90,(string *)local_60)
      ;
      local_91 = 0;
      puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)puVar3,&local_92);
      std::allocator<char>::~allocator((allocator<char> *)&local_92);
      local_91 = 1;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_60);
    }
    std::__cxx11::string::~string((string *)local_60);
  }
  else {
    LocatorStrategy::retrieve_license_content
              (__return_storage_ptr__,&this->super_LocatorStrategy,licenseLocation);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string ExternalDefinition::retrieve_license_content(const std::string &licenseLocation) const {
	if (licenseLocation == get_strategy_name()) {
		string licData(m_location->licenseData, mstrnlen_s(m_location->licenseData, LCC_API_MAX_LICENSE_DATA_LENGTH));
		if (m_location->license_data_type == LICENSE_ENCODED) {
			// FIXME what if license content is not base64
			vector<uint8_t> raw = unbase64(licData);
			string str = string(reinterpret_cast<char *>(raw.data()));
			return str;
		} else {
			return licData;
		}
	} else {
		return LocatorStrategy::retrieve_license_content(licenseLocation);
	}
}